

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

sg_pipeline sg_make_pipeline(sg_pipeline_desc *desc)

{
  sg_pipeline pip_id_00;
  undefined1 local_250 [8];
  sg_pipeline_desc desc_def;
  sg_pipeline_desc *desc_local;
  sg_pipeline pip_id;
  
  desc_def._560_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3b17,"sg_pipeline sg_make_pipeline(const sg_pipeline_desc *)");
  }
  if (desc == (sg_pipeline_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3b18,"sg_pipeline sg_make_pipeline(const sg_pipeline_desc *)");
  }
  _sg_pipeline_desc_defaults((sg_pipeline_desc *)local_250,desc);
  pip_id_00 = _sg_alloc_pipeline();
  if (pip_id_00.id == 0) {
    puts("pipeline pool exhausted!");
  }
  else {
    _sg_init_pipeline(pip_id_00,(sg_pipeline_desc *)local_250);
  }
  return (sg_pipeline)pip_id_00.id;
}

Assistant:

inline sg_pipeline sg_make_pipeline(const sg_pipeline_desc& desc) { return sg_make_pipeline(&desc); }